

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_ts2ci.c
# Opt level: O3

uint32 * mk_ts2ci(model_def_t *mdef)

{
  acmod_set_t *acmod_set;
  acmod_id_t aVar1;
  uint32 *puVar2;
  model_def_entry_t *pmVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  acmod_set = mdef->acmod_set;
  puVar2 = (uint32 *)
           __ckd_calloc__((ulong)mdef->n_tied_state,4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_ts2ci.c"
                          ,0x3e);
  if (mdef->n_tied_state == 0) {
    uVar7 = 0;
  }
  else {
    uVar5 = 0;
    do {
      puVar2[uVar5] = 0xffffffff;
      uVar5 = uVar5 + 1;
      uVar7 = (ulong)mdef->n_tied_state;
    } while (uVar5 < uVar7);
  }
  uVar4 = mdef->n_defn;
  if (uVar4 != 0) {
    pmVar3 = mdef->defn;
    uVar7 = 0;
    do {
      if (pmVar3[uVar7].n_state != 0) {
        uVar5 = 0;
        do {
          uVar6 = (ulong)pmVar3[uVar7].state[uVar5];
          if ((uVar6 != 0xffffffff) && (puVar2[uVar6] == 0xffffffff)) {
            if (mdef->n_tied_state <= pmVar3[uVar7].state[uVar5]) {
              __assert_fail("ts < mdef->n_tied_state",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_ts2ci.c"
                            ,0x47,"uint32 *mk_ts2ci(model_def_t *)");
            }
            aVar1 = acmod_set_base_phone(acmod_set,(acmod_id_t)uVar7);
            puVar2[uVar6] = aVar1;
            pmVar3 = mdef->defn;
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < pmVar3[uVar7].n_state);
        uVar4 = mdef->n_defn;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4);
    uVar7 = (ulong)mdef->n_tied_state;
  }
  if ((int)uVar7 != 0) {
    uVar5 = 0;
    do {
      if (puVar2[uVar5] == 0xffffffff) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/mk_ts2ci.c"
                ,0x50,"state %d has no mapping to a CI phone\n",uVar5 & 0xffffffff);
        uVar7 = (ulong)mdef->n_tied_state;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar7);
  }
  return puVar2;
}

Assistant:

uint32 *
mk_ts2ci(model_def_t *mdef)
{
    uint32 i, j;
    uint32 *map;
    uint32 ts;
    acmod_set_t *acmod_set = mdef->acmod_set;

    map = (uint32 *)ckd_calloc(mdef->n_tied_state, sizeof(uint32));

    for (i = 0; i < mdef->n_tied_state; i++)
	map[i] = TYING_NO_ID;

    for (i = 0; i < mdef->n_defn; i++) {
	for (j = 0; j < mdef->defn[i].n_state; j++) {
	    ts = mdef->defn[i].state[j];
	    if ((ts != TYING_NON_EMITTING) && (map[ts] == TYING_NO_ID)) {
		assert(ts < mdef->n_tied_state);

		map[ts] = acmod_set_base_phone(acmod_set, i);
	    }
	}
    }

    for (i = 0; i < mdef->n_tied_state; i++) {
	if (map[i] == TYING_NO_ID) {
	    E_WARN("state %d has no mapping to a CI phone\n", i);
	}
    }

    return map;
}